

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::getChunks(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *names,vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *chunks,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uchar *__last;
  pointer puVar5;
  uchar *chunk;
  char type [5];
  string name;
  uint local_98;
  allocator_type local_91;
  pointer local_90;
  char local_85 [5];
  value_type local_80;
  long local_60;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  puVar1 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 8;
  local_98 = 0;
  chunk = puVar5;
  local_90 = puVar5;
  local_58 = chunks;
  local_50 = names;
  do {
    if ((puVar1 <= chunk + 8) || (chunk < puVar5)) {
      return 0;
    }
    lodepng_chunk_type(local_85,chunk);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar4 = strlen(local_85);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,local_85,local_85 + sVar4);
    iVar3 = 1;
    if ((local_80._M_string_length == 4) &&
       (__last = lodepng_chunk_next_const(chunk), chunk < __last)) {
      iVar2 = std::__cxx11::string::compare((char *)&local_80);
      iVar3 = 0;
      if (iVar2 == 0) {
        local_98 = 0;
        puVar5 = local_90;
        chunk = __last;
        iVar3 = 0;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar2 == 0) {
          local_98 = 1;
          puVar5 = local_90;
          chunk = __last;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar2 == 0) {
            local_98 = 2;
            puVar5 = local_90;
            chunk = __last;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_80);
            puVar5 = local_90;
            if (iVar3 == 0) {
              iVar3 = 3;
            }
            else if (puVar1 < __last) {
              iVar3 = 1;
            }
            else {
              local_60 = (ulong)local_98 * 3;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_50 + local_98,&local_80);
              puVar5 = local_90;
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              vector<unsigned_char_const*,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,chunk,
                         __last,&local_91);
              std::
              vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          *)(&(local_58->
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + local_60),&local_48);
              chunk = __last;
              iVar3 = 0;
              if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  } while (iVar3 == 0);
  return (uint)(iVar3 != 3);
}

Assistant:

unsigned getChunks(std::vector<std::string> names[3],
                   std::vector<std::vector<unsigned char> > chunks[3],
                   const std::vector<unsigned char>& png) {
  const unsigned char *chunk, *next, *begin, *end;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  int location = 0;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    std::string name(type);
    if(name.size() != 4) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow

    if(name == "IHDR") {
      location = 0;
    } else if(name == "PLTE") {
      location = 1;
    } else if(name == "IDAT") {
      location = 2;
    } else if(name == "IEND") {
      break; // anything after IEND is not part of the PNG or the 3 groups here.
    } else {
      if(next > end) return 1; // invalid chunk, content too far
      names[location].push_back(name);
      chunks[location].push_back(std::vector<unsigned char>(chunk, next));
    }

    chunk = next;
  }
  return 0;
}